

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

int64_t spvtools::opt::anon_unknown_15::CalculateConstantTerm
                  (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   *recurrences,
                  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                  *constants)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppSVar3;
  long lVar4;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  *__range2;
  pointer ppSVar5;
  
  ppSVar1 = (recurrences->
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0;
  for (ppSVar5 = (recurrences->
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar1;
      ppSVar5 = ppSVar5 + 1) {
    iVar2 = (*(*ppSVar5)->offset_->_vptr_SENode[4])();
    lVar4 = lVar4 + *(long *)(CONCAT44(extraout_var,iVar2) + 0x30);
  }
  for (ppSVar3 = (constants->
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppSVar3 !=
      (constants->
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      )._M_impl.super__Vector_impl_data._M_finish; ppSVar3 = ppSVar3 + 1) {
    lVar4 = lVar4 + (*ppSVar3)->literal_value_;
  }
  return lVar4;
}

Assistant:

int64_t CalculateConstantTerm(const std::vector<SERecurrentNode*>& recurrences,
                              const std::vector<SEConstantNode*>& constants) {
  int64_t constant_term = 0;
  for (auto recurrence : recurrences) {
    constant_term +=
        recurrence->GetOffset()->AsSEConstantNode()->FoldToSingleValue();
  }

  for (auto constant : constants) {
    constant_term += constant->FoldToSingleValue();
  }

  return constant_term;
}